

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O0

void __thiscall
pbrt::TextureSceneEntity::TextureSceneEntity
          (TextureSceneEntity *this,string *texName,ParameterDictionary *parameters,FileLoc loc,
          AnimatedTransform *renderFromObject)

{
  FileLoc loc_00;
  size_t in_RCX;
  char *in_RDX;
  string *in_RSI;
  long in_RDI;
  ParameterDictionary *in_stack_fffffffffffffee8;
  ParameterDictionary *in_stack_fffffffffffffef0;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  AnimatedTransform *in_stack_ffffffffffffffb8;
  ParameterDictionary *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  TransformedSceneEntity *in_stack_ffffffffffffffd0;
  
  __a = (allocator<char> *)&stack0xffffffffffffffbf;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,__a);
  ParameterDictionary::ParameterDictionary(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  loc_00.filename._M_str = in_RDX;
  loc_00.filename._M_len = in_RCX;
  loc_00._16_8_ = in_RSI;
  TransformedSceneEntity::TransformedSceneEntity
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,loc_00,
             in_stack_ffffffffffffffb8);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x690a0d);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  std::__cxx11::string::string((string *)(in_RDI + 0x358),in_RSI);
  return;
}

Assistant:

TextureSceneEntity(const std::string &texName, ParameterDictionary parameters,
                       FileLoc loc, const AnimatedTransform &renderFromObject)
        : TransformedSceneEntity("", std::move(parameters), loc, renderFromObject),
          texName(texName) {}